

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaSimple.c
# Opt level: O2

Vec_Wrd_t * Pla_ManFxMinimize(word *pOn,int nVars)

{
  byte bVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  Vec_Wrd_t *p;
  word *pwVar5;
  word *p_00;
  Vec_Int_t *p_01;
  int *piVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  int nCapMin;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  int local_1f0;
  int local_1d4;
  int local_1b8 [32];
  int Count [32];
  int pDirs [32];
  
  bVar1 = (byte)nVars & 0x1f;
  uVar15 = 1 << bVar1;
  iVar14 = ((int)uVar15 >> 6) + (uint)((uint)nVars < 6);
  p = (Vec_Wrd_t *)malloc(0x10);
  p->nCap = 1000;
  p->nSize = 0;
  pwVar5 = (word *)malloc(8000);
  p->pArray = pwVar5;
  p_00 = (word *)calloc((long)iVar14,8);
  Count[0x1c] = 0;
  Count[0x1d] = 0;
  Count[0x1e] = 0;
  Count[0x1f] = 0;
  Count[0x18] = 0;
  Count[0x19] = 0;
  Count[0x1a] = 0;
  Count[0x1b] = 0;
  Count[0x14] = 0;
  Count[0x15] = 0;
  Count[0x16] = 0;
  Count[0x17] = 0;
  Count[0x10] = 0;
  Count[0x11] = 0;
  Count[0x12] = 0;
  Count[0x13] = 0;
  Count[0xc] = 0;
  Count[0xd] = 0;
  Count[0xe] = 0;
  Count[0xf] = 0;
  Count[8] = 0;
  Count[9] = 0;
  Count[10] = 0;
  Count[0xb] = 0;
  Count[4] = 0;
  Count[5] = 0;
  Count[6] = 0;
  Count[7] = 0;
  Count[0] = 0;
  Count[1] = 0;
  Count[2] = 0;
  Count[3] = 0;
  local_1b8[0x1c] = 0;
  local_1b8[0x1d] = 0;
  local_1b8[0x1e] = 0;
  local_1b8[0x1f] = 0;
  local_1b8[0x18] = 0;
  local_1b8[0x19] = 0;
  local_1b8[0x1a] = 0;
  local_1b8[0x1b] = 0;
  local_1b8[0x14] = 0;
  local_1b8[0x15] = 0;
  local_1b8[0x16] = 0;
  local_1b8[0x17] = 0;
  local_1b8[0x10] = 0;
  local_1b8[0x11] = 0;
  local_1b8[0x12] = 0;
  local_1b8[0x13] = 0;
  local_1b8[0xc] = 0;
  local_1b8[0xd] = 0;
  local_1b8[0xe] = 0;
  local_1b8[0xf] = 0;
  local_1b8[8] = 0;
  local_1b8[9] = 0;
  local_1b8[10] = 0;
  local_1b8[0xb] = 0;
  local_1b8[4] = 0;
  local_1b8[5] = 0;
  local_1b8[6] = 0;
  local_1b8[7] = 0;
  local_1b8[0] = 0;
  local_1b8[1] = 0;
  local_1b8[2] = 0;
  local_1b8[3] = 0;
  p_01 = (Vec_Int_t *)malloc(0x10);
  p_01->nCap = 1000;
  p_01->nSize = 0;
  piVar6 = (int *)malloc(4000);
  p_01->pArray = piVar6;
  local_1f0 = 0;
  if (1 << bVar1 < 1) {
    uVar15 = 0;
  }
  local_1d4 = 0;
  uVar11 = 0;
  do {
    uVar4 = (uint)uVar11;
    if (uVar15 == uVar4) {
      local_1b8[1] = local_1f0;
      local_1b8[0] = local_1d4;
      local_1f0 = 0;
      uVar11 = 0;
      do {
        uVar4 = (uint)uVar11;
        if (uVar4 == uVar15) {
          local_1b8[10] = local_1f0;
          putchar(10);
          uVar15 = Pla_TtCountOnes(pOn,iVar14);
          printf("Truth = %d. ",(ulong)uVar15);
          Pla_TtCountOnes(p_00,iVar14);
          printf("Cover = %d. ");
          putchar(10);
          printf("Count: ");
          for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 1) {
            if (Count[lVar10] != 0) {
              printf("%d=%d ");
            }
          }
          putchar(10);
          printf("Cubes: ");
          for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 1) {
            if (local_1b8[lVar10] != 0) {
              printf("%d=%d ");
            }
          }
          putchar(10);
          iVar14 = 0;
          if (nVars < 1) {
            nVars = 0;
          }
          iVar3 = p_01->nSize;
          for (uVar15 = 0; (int)(uVar15 | 1) < iVar3; uVar15 = uVar15 + 2) {
            uVar4 = Vec_IntEntry(p_01,uVar15);
            uVar7 = Vec_IntEntry(p_01,uVar15 | 1);
            uVar8 = 0;
            uVar11 = 0;
            for (uVar12 = 0; nVars != uVar12; uVar12 = uVar12 + 1) {
              if (uVar7 != uVar12) {
                if ((uVar4 >> (uVar12 & 0x1f) & 1) == 0) {
                  uVar11 = uVar11 | 1L << (uVar8 & 0x3e);
                }
                else {
                  uVar11 = uVar11 | 2L << (sbyte)(uVar8 & 0x3e);
                }
              }
              uVar8 = uVar8 + 2;
            }
            if (iVar14 == p->nCap) {
              nCapMin = iVar14 * 2;
              if (iVar14 < 0x10) {
                nCapMin = 0x10;
              }
              Vec_WrdGrow(p,nCapMin);
              pwVar5 = p->pArray;
              iVar14 = p->nSize;
            }
            lVar10 = (long)iVar14;
            iVar14 = iVar14 + 1;
            p->nSize = iVar14;
            pwVar5[lVar10] = uVar11;
          }
          free(p_01->pArray);
          free(p_01);
          free(p_00);
          return p;
        }
        uVar2 = uVar11 >> 6;
        uVar16 = 1L << ((byte)uVar11 & 0x3f);
        if (((pOn[uVar2] >> (uVar11 & 0x3f) & 1) != 0) &&
           (uVar11 = p_00[uVar2], (uVar11 & uVar16) == 0)) {
          uVar7 = Pla_ManExpendDirNum(pOn,nVars,uVar4,pDirs);
          uVar9 = 0;
          if (0 < (int)uVar7) {
            uVar9 = (ulong)uVar7;
          }
          for (uVar13 = 0; uVar9 != uVar13; uVar13 = uVar13 + 1) {
            uVar8 = uVar4 ^ 1 << (*(byte *)(pDirs + uVar13) & 0x1f);
            if (((pOn[(int)uVar8 >> 6] >> ((ulong)uVar8 & 0x3f) & 1) != 0) &&
               ((p_00[(int)uVar8 >> 6] & 1L << ((byte)uVar8 & 0x3f)) == 0)) {
              uVar9 = uVar13 & 0xffffffff;
              break;
            }
          }
          if ((uint)uVar9 == uVar7) {
            uVar9 = 0;
          }
          uVar7 = pDirs[uVar9];
          uVar8 = uVar4 ^ 1 << (uVar7 & 0x1f);
          p_00[uVar2] = uVar11 | uVar16;
          p_00[(int)uVar8 >> 6] = p_00[(int)uVar8 >> 6] | 1L << ((byte)uVar8 & 0x3f);
          local_1f0 = local_1f0 + 1;
          Vec_IntPushTwo(p_01,uVar4,uVar7);
        }
        uVar11 = (ulong)(uVar4 + 1);
      } while( true );
    }
    uVar2 = uVar11 >> 6;
    uVar16 = 1L << ((byte)uVar11 & 0x3f);
    if (((pOn[uVar2] >> (uVar11 & 0x3f) & 1) != 0) && (uVar11 = p_00[uVar2], (uVar11 & uVar16) == 0)
       ) {
      iVar3 = Pla_ManExpendDirNum(pOn,nVars,uVar4,pDirs);
      Count[iVar3] = Count[iVar3] + 1;
      if (iVar3 == 2) {
        uVar7 = 1 << ((byte)pDirs[0] & 0x1f) ^ 1 << ((byte)pDirs[1] & 0x1f) ^ uVar4;
        if ((pOn[(int)uVar7 >> 6] >> ((ulong)uVar7 & 0x3f) & 1) != 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/pla/plaSimple.c"
                        ,0xdb,"Vec_Wrd_t *Pla_ManFxMinimize(word *, int)");
        }
      }
      else {
        if (iVar3 == 1) {
          uVar7 = uVar4 ^ 1 << (pDirs[0] & 0x1fU);
          p_00[uVar2] = uVar11 | uVar16;
          p_00[(int)uVar7 >> 6] = p_00[(int)uVar7 >> 6] | 1L << ((byte)uVar7 & 0x3f);
          local_1f0 = local_1f0 + 1;
          iVar3 = pDirs[0];
        }
        else {
          if (iVar3 != 0) goto LAB_00309378;
          p_00[uVar2] = uVar11 | uVar16;
          local_1d4 = local_1d4 + 1;
          iVar3 = -1;
        }
        Vec_IntPushTwo(p_01,uVar4,iVar3);
      }
    }
LAB_00309378:
    uVar11 = (ulong)(uVar4 + 1);
  } while( true );
}

Assistant:

Vec_Wrd_t * Pla_ManFxMinimize( word * pOn, int nVars )
{
    int i, v, iMint, iVar, nMints = (1 << nVars);
    int nWords = Abc_Bit6WordNum( nMints );
    Vec_Wrd_t * vCubes = Vec_WrdAlloc( 1000 );
    word * pDc = ABC_CALLOC( word, nWords );
    int Count[32] = {0};
    int Cubes[32] = {0};
    Vec_Int_t * vStore = Vec_IntAlloc( 1000 );

    // count the number of expansion directions
    for ( i = 0; i < nMints; i++ )
        if ( Pla_TtGetBit(pOn, i) && !Pla_TtGetBit(pDc, i) )
        {
            int pDirs[32], nDirs = Pla_ManExpendDirNum(pOn, nVars, i, pDirs);
            Count[nDirs]++;
            if ( nDirs == 0 )
            {
                Pla_TtSetBit(pDc, i);
                Cubes[0]++;
                // save
                Vec_IntPushTwo( vStore, i, -1 );
                continue;
            }
            if ( nDirs == 1 )
            {
                //Pla_PrintBinary( (word *)&i, nVars );
                //printf( " %d \n", pDirs[0] );

                Pla_TtSetBit(pDc, i);
                Pla_TtSetBit(pDc, i ^ (1 << pDirs[0]));
                Cubes[1]++;
                // save
                Vec_IntPushTwo( vStore, i, pDirs[0] );
                continue;
            }
            if ( nDirs == 2 && Pla_TtGetBit(pOn, i ^ (1 << pDirs[0]) ^ (1 << pDirs[1])) )
            {
                assert( 0 );
                Pla_TtSetBit(pDc, i);
                Pla_TtSetBit(pDc, i ^ (1 << pDirs[0]));
                Pla_TtSetBit(pDc, i ^ (1 << pDirs[1]));
                Pla_TtSetBit(pDc, i ^ (1 << pDirs[0]) ^ (1 << pDirs[1]));
                Cubes[2]++;
                continue;
            }
        }

    // go through the remaining cubes
    for ( i = 0; i < nMints; i++ )
        if ( Pla_TtGetBit(pOn, i) && !Pla_TtGetBit(pDc, i) )
        {
            int pDirs[32], nDirs = Pla_ManExpendDirNum(pOn, nVars, i, pDirs);
            // find direction, which is not taken
            for ( v = 0; v < nDirs; v++ )
                if ( Pla_TtGetBit(pOn, i ^ (1 << pDirs[v])) && !Pla_TtGetBit(pDc, i ^ (1 << pDirs[v])) )
                    break;
            // if there is no open directions, use any one
            if ( v == nDirs )
                v = 0;
            // mark this one
            Pla_TtSetBit(pDc, i);
            Pla_TtSetBit(pDc, i ^ (1 << pDirs[v]));
            Cubes[10]++;
            // save
            Vec_IntPushTwo( vStore, i, pDirs[v] );
            continue;
        }

    printf( "\n" );
    printf( "Truth = %d. ", Pla_TtCountOnes(pOn, nWords) );
    printf( "Cover = %d. ", Pla_TtCountOnes(pDc, nWords) );
    printf( "\n" );

    printf( "Count: " );
    for ( i = 0; i < 16; i++ )
        if ( Count[i] )
            printf( "%d=%d ", i, Count[i] );
    printf( "\n" );

    printf( "Cubes: " );
    for ( i = 0; i < 16; i++ )
        if ( Cubes[i] )
            printf( "%d=%d ", i, Cubes[i] );
    printf( "\n" );

/*
    // extract cubes one at a time
    for ( i = 0; i < nMints; i++ )
        if ( Pla_TtGetBit(pOn, i) )
        {
            word Cube = 0;
            for ( v = 0; v < nVars; v++ )
                if ( (i >> v) & 1 )
                    Pla_CubeSetLit( &Cube, v, PLA_LIT_ONE );
                else
                    Pla_CubeSetLit( &Cube, v, PLA_LIT_ZERO );
            Vec_WrdPush( vCubes, Cube );
        }
*/
    Vec_IntForEachEntryDouble( vStore, iMint, iVar, i )
    {
        word Cube = 0;
        for ( v = 0; v < nVars; v++ )
        {
            if ( v == iVar )
                continue;
            if ( (iMint >> v) & 1 )
                Pla_CubeSetLit( &Cube, v, PLA_LIT_ONE );
            else
                Pla_CubeSetLit( &Cube, v, PLA_LIT_ZERO );
        }
        Vec_WrdPush( vCubes, Cube );
    }
    Vec_IntFree( vStore );

    // collect the minterms
    ABC_FREE( pDc );
    return vCubes;
}